

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<double,double,duckdb::ArgMinMaxState<double,double>>
               (ArgMinMaxState<double,_double> *state,double x_data,double y_data,
               AggregateBinaryInput *binary)

{
  unsigned_long *puVar1;
  bool bVar2;
  BY_TYPE_conflict1 local_28;
  ARG_TYPE_conflict1 local_20;
  
  puVar1 = (binary->right_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if ((puVar1 != (unsigned_long *)0x0) &&
     ((puVar1[binary->ridx >> 6] >> (binary->ridx & 0x3f) & 1) == 0)) {
    return;
  }
  local_28 = y_data;
  local_20 = x_data;
  bVar2 = GreaterThan::Operation<double>(&state->value,&local_28);
  if (!bVar2) {
    return;
  }
  puVar1 = (binary->left_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    (state->super_ArgMinMaxStateBase).arg_null = false;
  }
  else {
    bVar2 = (puVar1[binary->lidx >> 6] >> (binary->lidx & 0x3f) & 1) == 0;
    (state->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2) goto LAB_019c9346;
  }
  state->arg = local_20;
LAB_019c9346:
  state->value = local_28;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}